

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

void __thiscall
booster::locale::ios_info::string_set::string_set(string_set *this,string_set *other)

{
  void *pvVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  if (in_RSI[2] == 0) {
    in_RDI[2] = 0;
    in_RDI[1] = 0;
    *in_RDI = 0;
  }
  else {
    pvVar1 = operator_new__(in_RSI[1]);
    in_RDI[2] = pvVar1;
    in_RDI[1] = in_RSI[1];
    *in_RDI = *in_RSI;
    memcpy((void *)in_RDI[2],(void *)in_RSI[2],in_RDI[1]);
  }
  return;
}

Assistant:

ios_info::string_set::string_set(string_set const &other)
        {
            if(other.ptr!=0) {
                ptr=new char[other.size];
                size=other.size;
                type=other.type;
                memcpy(ptr,other.ptr,size);
            }
            else {
                ptr=0;
                size=0;
                type=0;
            }
        }